

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O3

Matrix<double,_5,_1,_0,_5,_1> *
DronePoseLib::ValtonenOrnhagArxiv2021::calculate_coefficients
          (Matrix<double,_5,_1,_0,_5,_1> *__return_storage_ptr__,Matrix<double,_27,_1,_0,_27,_1> *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_f8;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[5];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar38 = dVar89 * dVar140 * dVar1 * dVar2;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [3];
  dVar136 = -dVar10;
  dVar143 = dVar5 * dVar136 * dVar1;
  dVar14 = dVar10 * dVar5 * dVar1;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar15 = dVar5 * dVar136 * dVar1;
  dVar125 = dVar5 * dVar10 * dVar1;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [6];
  dVar16 = dVar10 * dVar140 * dVar5;
  dVar5 = dVar5 * dVar136 * dVar140;
  dVar137 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[7];
  dVar39 = dVar10 * dVar140 * dVar137;
  dVar137 = dVar136 * dVar140 * dVar137;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x11];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x12];
  dVar6 = -dVar89 * dVar140 * dVar1 * dVar2;
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar134 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar131 = dVar27 * dVar140 * dVar1 * dVar2;
  dVar93 = -dVar27 * dVar140 * dVar1 * dVar2;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x16];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [9];
  dVar75 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar7 = dVar14 * dVar2 * dVar37;
  dVar144 = dVar143 * dVar2 * dVar37;
  dVar154 = dVar125 * dVar2 * dVar37;
  dVar145 = dVar15 * dVar2 * dVar37;
  dVar94 = dVar13 * dVar13;
  dVar104 = dVar3 * dVar3;
  local_f8.m_row = 0;
  local_f8.m_col = 1;
  local_f8.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
  m_data.array[0] =
       dVar137 * dVar2 * dVar11 * dVar10 * dVar140 * dVar104 +
       dVar39 * dVar2 * dVar11 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar9 * dVar39 * dVar2 * dVar10 * dVar140 * dVar3 * dVar13 +
       dVar137 * dVar2 * dVar9 * dVar10 * dVar27 * dVar94 +
       dVar75 * dVar39 * dVar37 * dVar10 * dVar140 * dVar104 +
       dVar137 * dVar75 * dVar37 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar1 * dVar137 * dVar37 * dVar10 * dVar140 * dVar3 * dVar13 +
       dVar39 * dVar1 * dVar37 * dVar10 * dVar27 * dVar94 +
       dVar5 * dVar2 * dVar11 * dVar10 * dVar89 * dVar104 +
       dVar16 * dVar2 * dVar11 * dVar10 * dVar136 * dVar3 * dVar13 +
       dVar16 * dVar2 * dVar9 * dVar10 * dVar89 * dVar3 * dVar13 +
       dVar5 * dVar2 * dVar9 * dVar10 * dVar136 * dVar94 +
       dVar16 * dVar75 * dVar37 * dVar10 * dVar89 * dVar104 +
       dVar5 * dVar75 * dVar37 * dVar10 * dVar136 * dVar3 * dVar13 +
       dVar5 * dVar1 * dVar37 * dVar10 * dVar89 * dVar3 * dVar13 +
       dVar16 * dVar1 * dVar37 * dVar10 * dVar136 * dVar94 +
       dVar154 * dVar12 * dVar140 * dVar104 +
       dVar145 * dVar12 * dVar27 * dVar3 * dVar13 +
       dVar134 * dVar145 * dVar140 * dVar3 * dVar13 +
       dVar154 * dVar134 * dVar27 * dVar94 +
       dVar15 * dVar75 * dVar37 * dVar10 * dVar140 * dVar104 +
       dVar125 * dVar75 * dVar37 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar125 * dVar1 * dVar37 * dVar10 * dVar140 * dVar3 * dVar13 +
       dVar15 * dVar1 * dVar37 * dVar10 * dVar27 * dVar94 +
       dVar7 * dVar12 * dVar89 * dVar104 +
       dVar144 * dVar12 * dVar136 * dVar3 * dVar13 +
       dVar144 * dVar134 * dVar89 * dVar3 * dVar13 +
       dVar7 * dVar134 * dVar136 * dVar94 +
       dVar143 * dVar75 * dVar37 * dVar10 * dVar89 * dVar104 +
       dVar14 * dVar75 * dVar37 * dVar10 * dVar136 * dVar3 * dVar13 +
       dVar14 * dVar1 * dVar37 * dVar10 * dVar89 * dVar3 * dVar13 +
       dVar143 * dVar1 * dVar37 * dVar10 * dVar136 * dVar94 +
       dVar93 * dVar37 * dVar12 * dVar140 * dVar104 +
       dVar131 * dVar37 * dVar12 * dVar27 * dVar3 * dVar13 +
       dVar131 * dVar37 * dVar134 * dVar140 * dVar3 * dVar13 +
       dVar93 * dVar37 * dVar134 * dVar27 * dVar94 +
       dVar131 * dVar11 * dVar10 * dVar140 * dVar104 +
       dVar93 * dVar11 * dVar10 * dVar27 * dVar3 * dVar13 +
       dVar93 * dVar9 * dVar10 * dVar140 * dVar3 * dVar13 +
       dVar131 * dVar9 * dVar10 * dVar27 * dVar94 +
       dVar6 * dVar37 * dVar12 * dVar89 * dVar104 +
       dVar38 * dVar37 * dVar12 * dVar136 * dVar3 * dVar13 +
       dVar38 * dVar37 * dVar134 * dVar89 * dVar3 * dVar13 +
       dVar6 * dVar37 * dVar134 * dVar136 * dVar94 +
       dVar38 * dVar11 * dVar10 * dVar89 * dVar104 +
       dVar6 * dVar11 * dVar10 * dVar136 * dVar3 * dVar13 +
       dVar38 * dVar9 * dVar10 * dVar136 * dVar94 + dVar6 * dVar9 * dVar10 * dVar89 * dVar3 * dVar13
  ;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar75 = -dVar89;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [5];
  dVar132 = dVar89 * dVar9;
  dVar76 = dVar75 * dVar9;
  dVar95 = -dVar27;
  dVar126 = dVar27 * dVar9;
  dVar96 = dVar95 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar17 = -dVar10;
  dVar16 = dVar10 * dVar140;
  dVar40 = dVar140 * dVar17;
  dVar41 = dVar10 * dVar1;
  dVar133 = dVar1 * dVar17;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar58 = dVar140 * dVar75 * dVar5;
  dVar137 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x11];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar115 = dVar89 * dVar140 * dVar5;
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar134 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar105 = dVar1 * dVar75 * dVar5;
  dVar75 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar116 = dVar89 * dVar1 * dVar5;
  dVar117 = dVar116 * dVar2;
  dVar106 = dVar105 * dVar2;
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar18 = dVar132 * dVar89;
  dVar19 = dVar76 * dVar89;
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [7];
  dVar107 = dVar132 * dVar6;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar127 = dVar7 * dVar107;
  dVar77 = dVar76 * dVar5;
  dVar97 = dVar137 * dVar77;
  dVar78 = dVar126 * dVar89;
  dVar79 = dVar96 * dVar89;
  dVar80 = dVar40 * dVar89 * dVar7;
  dVar155 = dVar41 * dVar89;
  dVar81 = dVar133 * dVar89;
  dVar82 = dVar81 * dVar7;
  dVar42 = dVar17 * dVar9 * dVar89;
  dVar93 = dVar89 * dVar10 * dVar9;
  dVar94 = dVar93 * dVar7 * dVar12;
  dVar14 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xf];
  dVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar104 = dVar19 * dVar7 * dVar75;
  dVar76 = dVar76 * dVar6;
  dVar43 = dVar76 * dVar7;
  dVar132 = dVar132 * dVar5;
  dVar44 = dVar137 * dVar132;
  dVar98 = dVar140 * dVar95 * dVar5;
  dVar125 = dVar27 * dVar140 * dVar5;
  dVar131 = dVar125 * dVar7;
  dVar99 = dVar98 * dVar7;
  dVar143 = dVar79 * dVar7;
  dVar45 = dVar78 * dVar7;
  dVar46 = dVar16 * dVar89 * dVar7;
  dVar108 = dVar40 * dVar6;
  dVar100 = dVar16 * dVar6;
  dVar128 = dVar7 * dVar108;
  dVar101 = dVar100 * dVar7;
  dVar40 = dVar40 * dVar5;
  dVar102 = dVar137 * dVar40;
  dVar16 = dVar16 * dVar5;
  dVar20 = dVar137 * dVar16;
  dVar83 = dVar16 * dVar11;
  dVar84 = dVar16 * dVar7 * dVar134;
  dVar144 = dVar40 * dVar7 * dVar134;
  dVar21 = dVar155 * dVar7;
  dVar145 = dVar93 * dVar137 * dVar75;
  dVar47 = dVar75 * dVar42 * dVar11;
  dVar48 = dVar42 * dVar7 * dVar134;
  dVar59 = dVar13 * dVar13;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x18];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar154 = dVar132 * dVar11;
  dVar22 = dVar40 * dVar7 * dVar12;
  dVar23 = dVar16 * dVar7 * dVar12;
  dVar85 = dVar42 * dVar7 * dVar12;
  dVar24 = dVar77 * dVar11;
  dVar40 = dVar40 * dVar11;
  dVar109 = dVar42 * dVar137 * dVar75;
  dVar25 = dVar93 * dVar11 * dVar75;
  dVar8 = dVar93 * dVar7 * dVar134;
  dVar118 = dVar3 * dVar3;
  dVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar38 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x16];
  dVar26 = dVar18 * dVar7 * dVar75;
  dVar39 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x1a];
  dVar146 = dVar1 * dVar95 * dVar5;
  dVar119 = dVar27 * dVar1 * dVar5;
  dVar152 = dVar126 * dVar5;
  dVar95 = dVar96 * dVar5;
  dVar27 = dVar133 * dVar5;
  dVar5 = dVar41 * dVar5;
  dVar126 = dVar126 * dVar6;
  dVar96 = dVar96 * dVar6;
  dVar138 = dVar17 * dVar9 * dVar6;
  dVar148 = dVar10 * dVar9 * dVar6;
  dVar129 = dVar152 * dVar137;
  dVar28 = dVar95 * dVar137;
  dVar29 = dVar95 * dVar11;
  dVar30 = dVar152 * dVar11;
  dVar156 = dVar133 * dVar6 * dVar7;
  dVar142 = dVar41 * dVar6 * dVar7;
  dVar133 = dVar27 * dVar137;
  dVar31 = dVar5 * dVar137;
  dVar32 = dVar5 * dVar11;
  dVar33 = dVar27 * dVar11;
  dVar9 = dVar27 * dVar7 * dVar12;
  dVar10 = dVar5 * dVar7 * dVar12;
  dVar110 = dVar5 * dVar7 * dVar134;
  dVar139 = dVar27 * dVar7 * dVar134;
  dVar86 = dVar75 * dVar11 * dVar138;
  dVar87 = dVar138 * dVar7 * dVar134;
  dVar5 = dVar134 * dVar148 * dVar7;
  dVar88 = dVar148 * dVar7 * dVar12;
  dVar111 = dVar138 * dVar7 * dVar12;
  dVar6 = dVar96 * dVar7 * dVar75;
  dVar17 = dVar137 * dVar148 * dVar75;
  dVar34 = dVar138 * dVar137 * dVar75;
  dVar35 = dVar148 * dVar11 * dVar75;
  dVar36 = dVar16 * dVar16;
  dVar41 = dVar126 * dVar7 * dVar75;
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x17];
  dVar49 = dVar89 * dVar89;
  dVar60 = dVar38 * dVar38;
  dVar50 = dVar140 * dVar140;
  local_18 = dVar88 * dVar15 * dVar1 * dVar50 +
             dVar111 * dVar15 * dVar16 * dVar140 * dVar39 +
             dVar14 * dVar111 * dVar1 * dVar140 * dVar89 +
             dVar88 * dVar14 * dVar38 * dVar140 * dVar39 +
             dVar87 * dVar15 * dVar1 * dVar140 * dVar89 +
             dVar5 * dVar15 * dVar16 * dVar89 * dVar39 +
             dVar5 * dVar14 * dVar1 * dVar49 +
             dVar87 * dVar14 * dVar38 * dVar89 * dVar39 +
             dVar86 * dVar15 * dVar1 * dVar50 +
             dVar15 * dVar35 * dVar16 * dVar140 * dVar39 +
             dVar35 * dVar14 * dVar1 * dVar140 * dVar89 +
             dVar86 * dVar14 * dVar38 * dVar140 * dVar39 +
             dVar11 * dVar138 * dVar134 * dVar136 * dVar38 * dVar140 * dVar39 +
             dVar148 * dVar11 * dVar134 * dVar136 * dVar16 * dVar89 * dVar39 +
             dVar17 * dVar15 * dVar1 * dVar140 * dVar89 +
             dVar34 * dVar15 * dVar16 * dVar89 * dVar39 +
             dVar34 * dVar14 * dVar1 * dVar49 +
             dVar17 * dVar14 * dVar38 * dVar89 * dVar39 +
             dVar137 * dVar148 * dVar12 * dVar136 * dVar38 * dVar140 * dVar39 +
             dVar138 * dVar137 * dVar12 * dVar136 * dVar16 * dVar89 * dVar39 +
             dVar94 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar85 * dVar3 * dVar140 * dVar39 +
             dVar85 * dVar14 * dVar27 * dVar140 * dVar89 +
             dVar94 * dVar14 * dVar13 * dVar140 * dVar39 +
             dVar48 * dVar15 * dVar27 * dVar140 * dVar89 +
             dVar8 * dVar15 * dVar3 * dVar89 * dVar39 +
             dVar8 * dVar14 * dVar27 * dVar49 +
             dVar48 * dVar14 * dVar13 * dVar89 * dVar39 +
             dVar47 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar25 * dVar3 * dVar140 * dVar39 +
             dVar25 * dVar14 * dVar27 * dVar140 * dVar89 +
             dVar47 * dVar14 * dVar13 * dVar140 * dVar39 +
             dVar42 * dVar11 * dVar134 * dVar136 * dVar13 * dVar140 * dVar39 +
             dVar93 * dVar11 * dVar134 * dVar136 * dVar3 * dVar89 * dVar39 +
             dVar145 * dVar15 * dVar27 * dVar140 * dVar89 +
             dVar109 * dVar15 * dVar3 * dVar89 * dVar39 +
             dVar109 * dVar14 * dVar27 * dVar49 +
             dVar145 * dVar14 * dVar13 * dVar89 * dVar39 +
             dVar93 * dVar137 * dVar12 * dVar136 * dVar13 * dVar140 * dVar39 +
             dVar42 * dVar137 * dVar12 * dVar136 * dVar3 * dVar89 * dVar39 +
             dVar9 * dVar15 * dVar1 * dVar50 +
             dVar15 * dVar10 * dVar16 * dVar140 * dVar39 +
             dVar10 * dVar14 * dVar1 * dVar140 * dVar89 +
             dVar9 * dVar14 * dVar16 * dVar89 * dVar39 +
             dVar110 * dVar15 * dVar1 * dVar140 * dVar89 +
             dVar139 * dVar15 * dVar38 * dVar140 * dVar39 +
             dVar14 * dVar139 * dVar1 * dVar49 +
             dVar14 * dVar110 * dVar38 * dVar89 * dVar39 +
             dVar32 * dVar75 * dVar14 * dVar38 * dVar140 * dVar39 +
             dVar33 * dVar75 * dVar14 * dVar16 * dVar89 * dVar39 +
             dVar12 * dVar32 * dVar136 * dVar1 * dVar50 +
             dVar12 * dVar33 * dVar136 * dVar16 * dVar140 * dVar39 +
             dVar33 * dVar134 * dVar136 * dVar1 * dVar140 * dVar89 +
             dVar32 * dVar134 * dVar136 * dVar38 * dVar140 * dVar39 +
             dVar133 * dVar75 * dVar15 * dVar38 * dVar140 * dVar39 +
             dVar31 * dVar75 * dVar15 * dVar16 * dVar89 * dVar39 +
             dVar133 * dVar12 * dVar136 * dVar1 * dVar140 * dVar89 +
             dVar31 * dVar12 * dVar136 * dVar16 * dVar89 * dVar39 +
             dVar31 * dVar134 * dVar136 * dVar1 * dVar49 +
             dVar133 * dVar134 * dVar136 * dVar38 * dVar89 * dVar39 +
             dVar142 * dVar75 * dVar15 * dVar16 * dVar38 * dVar140 +
             dVar156 * dVar75 * dVar15 * dVar36 * dVar89 +
             dVar156 * dVar75 * dVar14 * dVar60 * dVar140 +
             dVar142 * dVar75 * dVar14 * dVar16 * dVar38 * dVar89 +
             dVar156 * dVar12 * dVar136 * dVar16 * dVar38 * dVar140 +
             dVar142 * dVar12 * dVar136 * dVar36 * dVar89 +
             dVar134 * dVar142 * dVar136 * dVar60 * dVar140 +
             dVar134 * dVar156 * dVar136 * dVar16 * dVar38 * dVar89 +
             dVar21 * dVar75 * dVar15 * dVar3 * dVar38 * dVar140 +
             dVar82 * dVar75 * dVar15 * dVar3 * dVar16 * dVar89 +
             dVar82 * dVar75 * dVar14 * dVar13 * dVar38 * dVar140 +
             dVar21 * dVar75 * dVar14 * dVar13 * dVar16 * dVar89 +
             dVar82 * dVar12 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar21 * dVar12 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar21 * dVar134 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar82 * dVar134 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar155 * dVar11 * dVar75 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar81 * dVar11 * dVar75 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar81 * dVar137 * dVar75 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar155 * dVar137 * dVar75 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar22 * dVar15 * dVar27 * dVar50 +
             dVar15 * dVar23 * dVar3 * dVar140 * dVar39 +
             dVar23 * dVar14 * dVar27 * dVar140 * dVar89 +
             dVar22 * dVar14 * dVar3 * dVar89 * dVar39 +
             dVar84 * dVar15 * dVar27 * dVar140 * dVar89 +
             dVar144 * dVar15 * dVar13 * dVar140 * dVar39 +
             dVar14 * dVar144 * dVar27 * dVar49 +
             dVar14 * dVar84 * dVar13 * dVar89 * dVar39 +
             dVar83 * dVar75 * dVar14 * dVar13 * dVar140 * dVar39 +
             dVar40 * dVar75 * dVar14 * dVar3 * dVar89 * dVar39 +
             dVar12 * dVar83 * dVar136 * dVar27 * dVar50 +
             dVar12 * dVar40 * dVar136 * dVar3 * dVar140 * dVar39 +
             dVar40 * dVar134 * dVar136 * dVar27 * dVar140 * dVar89 +
             dVar83 * dVar134 * dVar136 * dVar13 * dVar140 * dVar39 +
             dVar102 * dVar75 * dVar15 * dVar13 * dVar140 * dVar39 +
             dVar20 * dVar75 * dVar15 * dVar3 * dVar89 * dVar39 +
             dVar102 * dVar12 * dVar136 * dVar27 * dVar140 * dVar89 +
             dVar20 * dVar12 * dVar136 * dVar3 * dVar89 * dVar39 +
             dVar134 * dVar20 * dVar136 * dVar27 * dVar49 +
             dVar134 * dVar102 * dVar136 * dVar13 * dVar89 * dVar39 +
             dVar101 * dVar75 * dVar15 * dVar13 * dVar16 * dVar140 +
             dVar15 * dVar128 * dVar75 * dVar3 * dVar16 * dVar89 +
             dVar128 * dVar75 * dVar14 * dVar13 * dVar38 * dVar140 +
             dVar101 * dVar75 * dVar14 * dVar3 * dVar38 * dVar89 +
             dVar128 * dVar12 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar101 * dVar12 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar101 * dVar134 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar128 * dVar134 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar108 * dVar11 * dVar75 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar100 * dVar11 * dVar75 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar100 * dVar137 * dVar75 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar108 * dVar137 * dVar75 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar46 * dVar75 * dVar15 * dVar3 * dVar13 * dVar140 +
             dVar80 * dVar75 * dVar15 * dVar118 * dVar89 +
             dVar80 * dVar75 * dVar14 * dVar59 * dVar140 +
             dVar46 * dVar75 * dVar14 * dVar3 * dVar13 * dVar89 +
             dVar80 * dVar12 * dVar136 * dVar3 * dVar13 * dVar140 +
             dVar46 * dVar12 * dVar136 * dVar118 * dVar89 +
             dVar134 * dVar46 * dVar136 * dVar59 * dVar140 +
             dVar134 * dVar80 * dVar136 * dVar3 * dVar13 * dVar89 +
             dVar95 * dVar7 * dVar12 * dVar14 * dVar38 * dVar140 * dVar39 +
             dVar152 * dVar7 * dVar12 * dVar14 * dVar16 * dVar89 * dVar39 +
             dVar152 * dVar7 * dVar134 * dVar15 * dVar38 * dVar140 * dVar39 +
             dVar95 * dVar7 * dVar134 * dVar15 * dVar16 * dVar89 * dVar39 +
             dVar30 * dVar75 * dVar15 * dVar1 * dVar50 +
             dVar29 * dVar75 * dVar15 * dVar16 * dVar140 * dVar39 +
             dVar29 * dVar75 * dVar14 * dVar1 * dVar140 * dVar89 +
             dVar30 * dVar75 * dVar14 * dVar16 * dVar89 * dVar39 +
             dVar29 * dVar12 * dVar136 * dVar1 * dVar50 +
             dVar30 * dVar12 * dVar136 * dVar16 * dVar140 * dVar39 +
             dVar30 * dVar134 * dVar136 * dVar1 * dVar140 * dVar89 +
             dVar29 * dVar134 * dVar136 * dVar16 * dVar89 * dVar39 +
             dVar28 * dVar75 * dVar15 * dVar1 * dVar140 * dVar89 +
             dVar129 * dVar75 * dVar15 * dVar38 * dVar140 * dVar39 +
             dVar129 * dVar75 * dVar14 * dVar1 * dVar49 +
             dVar28 * dVar75 * dVar14 * dVar38 * dVar89 * dVar39 +
             dVar129 * dVar12 * dVar136 * dVar1 * dVar140 * dVar89 +
             dVar28 * dVar12 * dVar136 * dVar38 * dVar140 * dVar39 +
             dVar28 * dVar134 * dVar136 * dVar1 * dVar49 +
             dVar129 * dVar134 * dVar136 * dVar38 * dVar89 * dVar39 +
             dVar6 * dVar15 * dVar16 * dVar38 * dVar140 +
             dVar41 * dVar15 * dVar36 * dVar89 +
             dVar14 * dVar41 * dVar60 * dVar140 +
             dVar14 * dVar6 * dVar16 * dVar38 * dVar89 +
             dVar126 * dVar11 * dVar75 * dVar136 * dVar16 * dVar38 * dVar140 +
             dVar96 * dVar11 * dVar75 * dVar136 * dVar36 * dVar89 +
             dVar137 * dVar96 * dVar75 * dVar136 * dVar60 * dVar140 +
             dVar137 * dVar126 * dVar75 * dVar136 * dVar16 * dVar38 * dVar89 +
             dVar143 * dVar75 * dVar15 * dVar3 * dVar38 * dVar140 +
             dVar45 * dVar75 * dVar15 * dVar3 * dVar16 * dVar89 +
             dVar45 * dVar75 * dVar14 * dVar13 * dVar38 * dVar140 +
             dVar143 * dVar75 * dVar14 * dVar13 * dVar16 * dVar89 +
             dVar12 * dVar143 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar12 * dVar45 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar45 * dVar134 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar143 * dVar134 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar78 * dVar11 * dVar75 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar79 * dVar11 * dVar75 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar79 * dVar137 * dVar75 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar78 * dVar137 * dVar75 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar119 * dVar7 * dVar12 * dVar136 * dVar16 * dVar38 * dVar140 +
             dVar146 * dVar7 * dVar12 * dVar136 * dVar36 * dVar89 +
             dVar146 * dVar7 * dVar134 * dVar136 * dVar60 * dVar140 +
             dVar119 * dVar7 * dVar134 * dVar136 * dVar16 * dVar38 * dVar89 +
             dVar146 * dVar11 * dVar75 * dVar136 * dVar16 * dVar38 * dVar140 +
             dVar119 * dVar11 * dVar75 * dVar136 * dVar36 * dVar89 +
             dVar137 * dVar119 * dVar75 * dVar136 * dVar60 * dVar140 +
             dVar137 * dVar146 * dVar75 * dVar136 * dVar16 * dVar38 * dVar89 +
             dVar131 * dVar75 * dVar15 * dVar13 * dVar16 * dVar140 +
             dVar99 * dVar75 * dVar15 * dVar3 * dVar38 * dVar140 +
             dVar14 * dVar99 * dVar75 * dVar13 * dVar16 * dVar89 +
             dVar14 * dVar131 * dVar75 * dVar3 * dVar38 * dVar89 +
             dVar12 * dVar131 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar12 * dVar99 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar134 * dVar99 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar134 * dVar131 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar98 * dVar11 * dVar75 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar125 * dVar11 * dVar75 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar137 * dVar125 * dVar75 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar137 * dVar98 * dVar75 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar77 * dVar7 * dVar12 * dVar14 * dVar13 * dVar140 * dVar39 +
             dVar132 * dVar7 * dVar12 * dVar14 * dVar3 * dVar89 * dVar39 +
             dVar132 * dVar7 * dVar134 * dVar15 * dVar13 * dVar140 * dVar39 +
             dVar77 * dVar7 * dVar134 * dVar15 * dVar3 * dVar89 * dVar39 +
             dVar154 * dVar75 * dVar15 * dVar27 * dVar50 +
             dVar24 * dVar75 * dVar15 * dVar3 * dVar140 * dVar39 +
             dVar24 * dVar75 * dVar14 * dVar27 * dVar140 * dVar89 +
             dVar154 * dVar75 * dVar14 * dVar3 * dVar89 * dVar39 +
             dVar24 * dVar12 * dVar136 * dVar27 * dVar50 +
             dVar154 * dVar12 * dVar136 * dVar3 * dVar140 * dVar39 +
             dVar154 * dVar134 * dVar136 * dVar27 * dVar140 * dVar89 +
             dVar24 * dVar134 * dVar136 * dVar3 * dVar89 * dVar39 +
             dVar97 * dVar75 * dVar15 * dVar27 * dVar140 * dVar89 +
             dVar44 * dVar75 * dVar15 * dVar13 * dVar140 * dVar39 +
             dVar44 * dVar75 * dVar14 * dVar27 * dVar49 +
             dVar97 * dVar75 * dVar14 * dVar13 * dVar89 * dVar39 +
             dVar44 * dVar12 * dVar136 * dVar27 * dVar140 * dVar89 +
             dVar97 * dVar12 * dVar136 * dVar13 * dVar140 * dVar39 +
             dVar134 * dVar97 * dVar136 * dVar27 * dVar49 +
             dVar134 * dVar44 * dVar136 * dVar13 * dVar89 * dVar39 +
             dVar43 * dVar75 * dVar15 * dVar13 * dVar16 * dVar140 +
             dVar15 * dVar127 * dVar75 * dVar3 * dVar16 * dVar89 +
             dVar127 * dVar75 * dVar14 * dVar13 * dVar38 * dVar140 +
             dVar43 * dVar75 * dVar14 * dVar3 * dVar38 * dVar89 +
             dVar127 * dVar12 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar43 * dVar12 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar43 * dVar134 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar127 * dVar134 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar107 * dVar11 * dVar75 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar76 * dVar11 * dVar75 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar76 * dVar137 * dVar75 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar107 * dVar137 * dVar75 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar104 * dVar15 * dVar3 * dVar13 * dVar140 +
             dVar26 * dVar15 * dVar118 * dVar89 +
             dVar14 * dVar26 * dVar59 * dVar140 +
             dVar14 * dVar104 * dVar3 * dVar13 * dVar89 +
             dVar18 * dVar11 * dVar75 * dVar136 * dVar3 * dVar13 * dVar140 +
             dVar19 * dVar11 * dVar75 * dVar136 * dVar118 * dVar89 +
             dVar137 * dVar19 * dVar75 * dVar136 * dVar59 * dVar140 +
             dVar137 * dVar18 * dVar75 * dVar136 * dVar3 * dVar13 * dVar89 +
             dVar106 * dVar75 * dVar15 * dVar13 * dVar16 * dVar140 +
             dVar117 * dVar75 * dVar15 * dVar3 * dVar38 * dVar140 +
             dVar117 * dVar75 * dVar14 * dVar13 * dVar16 * dVar89 +
             dVar106 * dVar75 * dVar14 * dVar3 * dVar38 * dVar89 +
             dVar12 * dVar117 * dVar136 * dVar13 * dVar16 * dVar140 +
             dVar12 * dVar106 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar106 * dVar134 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar117 * dVar134 * dVar136 * dVar3 * dVar38 * dVar89 +
             dVar105 * dVar11 * dVar75 * dVar136 * dVar3 * dVar38 * dVar140 +
             dVar116 * dVar11 * dVar75 * dVar136 * dVar3 * dVar16 * dVar89 +
             dVar137 * dVar116 * dVar75 * dVar136 * dVar13 * dVar38 * dVar140 +
             dVar137 * dVar105 * dVar75 * dVar136 * dVar13 * dVar16 * dVar89 +
             dVar115 * dVar2 * dVar12 * dVar136 * dVar3 * dVar13 * dVar140 +
             dVar58 * dVar2 * dVar12 * dVar136 * dVar118 * dVar89 +
             dVar58 * dVar2 * dVar134 * dVar136 * dVar59 * dVar140 +
             dVar115 * dVar2 * dVar134 * dVar136 * dVar3 * dVar13 * dVar89 +
             dVar58 * dVar11 * dVar37 * dVar136 * dVar3 * dVar13 * dVar140 +
             dVar115 * dVar11 * dVar37 * dVar136 * dVar118 * dVar89 +
             dVar58 * dVar137 * dVar37 * dVar136 * dVar3 * dVar13 * dVar89 +
             dVar115 * dVar137 * dVar37 * dVar136 * dVar59 * dVar140;
  local_f8.m_xpr = __return_storage_ptr__;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_f8,&local_18);
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar134 = -dVar27;
  dVar120 = dVar140 * dVar134 * dVar89;
  dVar155 = dVar27 * dVar140 * dVar89;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xb];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar14 = dVar27 * dVar140 * dVar2;
  dVar15 = dVar140 * dVar134 * dVar2;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar41 = dVar27 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar61 = dVar41 * dVar10;
  dVar18 = dVar9 * dVar134;
  dVar121 = dVar18 * dVar10;
  dVar16 = dVar41 * dVar89 * dVar1;
  dVar38 = dVar18 * dVar89 * dVar1;
  dVar41 = dVar41 * dVar2;
  dVar18 = dVar18 * dVar2;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [5];
  dVar27 = dVar27 * dVar5;
  dVar43 = dVar27 * dVar10;
  dVar137 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar39 = dVar137 * dVar43;
  dVar134 = dVar134 * dVar5;
  dVar48 = dVar134 * dVar10;
  dVar45 = dVar27 * dVar89;
  dVar75 = dVar134 * dVar89;
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar20 = -dVar136;
  dVar6 = dVar140 * dVar20;
  dVar59 = dVar6 * dVar10 * dVar1;
  dVar19 = dVar136 * dVar140;
  dVar60 = dVar19 * dVar10 * dVar1;
  dVar93 = dVar6 * dVar89;
  dVar77 = dVar19 * dVar89;
  dVar6 = dVar6 * dVar2;
  dVar19 = dVar19 * dVar2;
  dVar156 = dVar136 * dVar9 * dVar10;
  dVar94 = dVar9 * dVar20 * dVar10;
  dVar78 = dVar136 * dVar9 * dVar2;
  dVar149 = dVar9 * dVar20 * dVar2;
  dVar136 = dVar136 * dVar5;
  dVar49 = dVar136 * dVar10;
  dVar20 = dVar20 * dVar5;
  dVar7 = dVar20 * dVar10;
  dVar58 = dVar136 * dVar89;
  dVar104 = dVar137 * dVar58;
  dVar79 = dVar20 * dVar89;
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [2];
  dVar37 = -dVar3;
  dVar11 = dVar3 * dVar140;
  dVar140 = dVar140 * dVar37;
  dVar125 = dVar140 * dVar10;
  dVar80 = dVar11 * dVar10;
  dVar23 = dVar140 * dVar89;
  dVar131 = dVar11 * dVar89;
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar81 = dVar13 * dVar131;
  dVar82 = dVar13 * dVar23;
  dVar29 = dVar3 * dVar9;
  dVar9 = dVar9 * dVar37;
  dVar28 = dVar9 * dVar10;
  dVar95 = dVar29 * dVar10;
  dVar83 = dVar13 * dVar95;
  dVar84 = dVar13 * dVar28;
  dVar51 = dVar9 * dVar89;
  dVar85 = dVar137 * dVar51;
  dVar86 = dVar29 * dVar89;
  dVar50 = dVar37 * dVar5 * dVar10;
  dVar10 = dVar10 * dVar3 * dVar5;
  dVar62 = dVar37 * dVar5 * dVar89;
  dVar89 = dVar3 * dVar5 * dVar89;
  dVar143 = dVar18 * dVar13;
  dVar144 = dVar41 * dVar13;
  dVar63 = dVar48 * dVar13;
  dVar145 = dVar43 * dVar13;
  dVar154 = dVar75 * dVar13;
  dVar40 = dVar45 * dVar13;
  dVar8 = dVar27 * dVar2 * dVar13;
  dVar103 = dVar137 * dVar134 * dVar2;
  local_58 = dVar134 * dVar2 * dVar13;
  dVar87 = dVar19 * dVar13;
  dVar88 = dVar6 * dVar13;
  dVar96 = dVar49 * dVar13;
  dVar97 = dVar7 * dVar13;
  dVar17 = dVar79 * dVar13;
  dVar98 = dVar58 * dVar13;
  dVar147 = dVar136 * dVar2 * dVar13;
  dVar150 = dVar20 * dVar2 * dVar13;
  dVar157 = dVar80 * dVar13;
  dVar99 = dVar125 * dVar13;
  dVar153 = dVar140 * dVar2 * dVar13;
  dVar112 = dVar137 * dVar11 * dVar2;
  dVar52 = dVar11 * dVar2 * dVar13;
  dVar53 = dVar86 * dVar13;
  dVar54 = dVar51 * dVar13;
  dVar55 = dVar9 * dVar2 * dVar13;
  dVar56 = dVar29 * dVar2 * dVar13;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x11];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x12];
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar134 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar100 = dVar15 * dVar1 * dVar12;
  dVar101 = dVar14 * dVar1 * dVar12;
  dVar122 = dVar41 * dVar137;
  dVar102 = dVar18 * dVar137;
  dVar105 = dVar134 * dVar41 * dVar1;
  dVar123 = dVar134 * dVar18 * dVar1;
  dVar90 = dVar41 * dVar1 * dVar12;
  dVar106 = dVar18 * dVar1 * dVar12;
  dVar107 = dVar48 * dVar137;
  dVar132 = dVar43 * dVar1 * dVar12;
  dVar108 = dVar48 * dVar1 * dVar12;
  dVar64 = dVar45 * dVar137;
  dVar65 = dVar75 * dVar137;
  dVar109 = dVar45 * dVar1 * dVar12;
  dVar110 = dVar75 * dVar1 * dVar12;
  local_48 = dVar27 * dVar2 * dVar137;
  uStack_40 = 0;
  uStack_50 = 0x8000000000000000;
  dVar66 = dVar6 * dVar137;
  dVar111 = dVar19 * dVar137;
  dVar115 = dVar134 * dVar19 * dVar1;
  dVar91 = dVar134 * dVar6 * dVar1;
  dVar116 = dVar6 * dVar1 * dVar12;
  dVar67 = dVar19 * dVar1 * dVar12;
  dVar117 = dVar149 * dVar1 * dVar12;
  dVar118 = dVar78 * dVar1 * dVar12;
  dVar68 = dVar49 * dVar137;
  dVar69 = dVar7 * dVar137;
  dVar119 = dVar49 * dVar1 * dVar12;
  dVar126 = dVar7 * dVar1 * dVar12;
  dVar127 = dVar79 * dVar137;
  dVar41 = dVar58 * dVar1 * dVar12;
  dVar18 = dVar79 * dVar1 * dVar12;
  dVar19 = dVar20 * dVar2 * dVar137;
  dVar128 = dVar136 * dVar2 * dVar137;
  dVar20 = dVar125 * dVar137;
  dVar129 = dVar80 * dVar137;
  dVar21 = dVar23 * dVar137;
  dVar22 = dVar131 * dVar137;
  dVar138 = dVar134 * dVar131 * dVar1;
  dVar70 = dVar134 * dVar23 * dVar1;
  dVar139 = dVar23 * dVar1 * dVar12;
  dVar131 = dVar131 * dVar1 * dVar12;
  dVar23 = dVar140 * dVar2 * dVar137;
  dVar24 = dVar28 * dVar137;
  dVar25 = dVar95 * dVar137;
  dVar26 = dVar134 * dVar28 * dVar1;
  dVar71 = dVar134 * dVar95 * dVar1;
  dVar95 = dVar95 * dVar1 * dVar12;
  dVar142 = dVar28 * dVar1 * dVar12;
  dVar28 = dVar86 * dVar137;
  dVar29 = dVar29 * dVar2 * dVar137;
  dVar146 = dVar9 * dVar2 * dVar137;
  dVar30 = dVar50 * dVar137 * dVar12;
  dVar133 = dVar10 * dVar137 * dVar12;
  dVar31 = dVar62 * dVar137 * dVar12;
  dVar135 = dVar137 * dVar89 * dVar12;
  dVar72 = dVar15 * dVar137 * dVar5;
  dVar92 = dVar14 * dVar137 * dVar5;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar32 = dVar15 * dVar13 * dVar5;
  dVar33 = dVar121 * dVar1 * dVar5;
  dVar73 = dVar61 * dVar1 * dVar5;
  dVar34 = dVar77 * dVar1 * dVar5;
  dVar141 = dVar93 * dVar1 * dVar5;
  dVar35 = dVar149 * dVar137 * dVar5;
  dVar36 = dVar78 * dVar137 * dVar5;
  dVar42 = dVar149 * dVar13 * dVar5;
  dVar130 = dVar5 * dVar14 * dVar13;
  dVar158 = dVar14 * dVar1 * dVar134;
  dVar76 = dVar15 * dVar1 * dVar134;
  dVar43 = dVar43 * dVar1 * dVar134;
  local_a8 = dVar43 * dVar140 * dVar37;
  uStack_a0 = 0;
  local_98 = dVar65 * dVar5 * dVar140 * dVar37;
  uStack_90 = 0x8000000000000000;
  dVar44 = dVar75 * dVar1 * dVar134;
  dVar45 = dVar45 * dVar1 * dVar134;
  local_88 = dVar111 * dVar5 * dVar140 * dVar37;
  uStack_80 = 0;
  local_78 = dVar68 * dVar5 * dVar140 * dVar37;
  uStack_70 = 0;
  dVar46 = dVar7 * dVar1 * dVar134;
  local_68 = dVar157 * dVar5 * dVar140 * dVar37;
  uStack_60 = 0;
  dVar47 = dVar10 * dVar13 * dVar134;
  dVar151 = dVar37 * dVar37;
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar48 = dVar48 * dVar1 * dVar134;
  dVar148 = dVar49 * dVar1 * dVar134;
  dVar49 = dVar50 * dVar13 * dVar134;
  dVar124 = dVar11 * dVar11;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x15];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar57 = dVar5 * dVar78 * dVar13;
  dVar50 = dVar149 * dVar1 * dVar134;
  dVar58 = dVar58 * dVar1 * dVar134;
  dVar74 = dVar9 * dVar9;
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar75 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x1a];
  dVar113 = dVar78 * dVar1 * dVar134;
  dVar114 = dVar2 * dVar2;
  local_d8 = dVar53 * dVar5 * dVar140 * dVar2;
  uStack_d0 = 0;
  local_b8 = dVar31 * dVar140 * dVar2;
  uStack_b0 = 0x8000000000000000;
  dVar152 = dVar89 * dVar13 * dVar134;
  local_c8 = dVar152 * dVar140 * dVar2;
  uStack_c0 = 0;
  dVar79 = dVar79 * dVar1 * dVar134;
  dVar62 = dVar62 * dVar13 * dVar134;
  dVar89 = dVar7 * dVar7;
  local_20 = dVar152 * dVar27 * dVar136 * dVar6 * dVar7 +
             dVar62 * dVar27 * dVar9 * dVar89 +
             dVar140 * dVar62 * dVar136 * dVar75 * dVar7 +
             local_c8 * dVar89 +
             dVar31 * dVar27 * dVar136 * dVar6 * dVar7 +
             dVar135 * dVar27 * dVar9 * dVar89 +
             dVar135 * dVar140 * dVar136 * dVar75 * dVar7 +
             local_b8 * dVar89 +
             dVar47 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar49 * dVar27 * dVar11 * dVar89 +
             dVar49 * dVar140 * dVar10 * dVar75 * dVar7 +
             dVar47 * dVar140 * dVar37 * dVar89 +
             dVar30 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar133 * dVar27 * dVar11 * dVar89 +
             dVar133 * dVar140 * dVar10 * dVar75 * dVar7 +
             dVar140 * dVar30 * dVar37 * dVar89 +
             dVar55 * dVar12 * dVar140 * dVar136 * dVar6 * dVar7 +
             dVar56 * dVar12 * dVar140 * dVar9 * dVar89 +
             dVar56 * dVar134 * dVar140 * dVar136 * dVar75 * dVar7 +
             dVar55 * dVar134 * dVar140 * dVar2 * dVar89 +
             dVar29 * dVar12 * dVar27 * dVar136 * dVar6 * dVar7 +
             dVar146 * dVar12 * dVar27 * dVar9 * dVar89 +
             dVar146 * dVar134 * dVar27 * dVar136 * dVar75 * dVar7 +
             dVar134 * dVar29 * dVar27 * dVar2 * dVar89 +
             dVar86 * dVar1 * dVar12 * dVar140 * dVar2 * dVar136 * dVar6 +
             dVar51 * dVar1 * dVar12 * dVar140 * dVar9 * dVar136 * dVar75 +
             dVar51 * dVar1 * dVar134 * dVar27 * dVar2 * dVar136 * dVar6 +
             dVar86 * dVar1 * dVar134 * dVar27 * dVar9 * dVar136 * dVar75 +
             dVar54 * dVar5 * dVar27 * dVar9 * dVar136 * dVar6 +
             dVar53 * dVar5 * dVar27 * dVar74 * dVar7 +
             local_d8 * dVar136 * dVar6 +
             dVar54 * dVar5 * dVar140 * dVar9 * dVar2 * dVar7 +
             dVar53 * dVar12 * dVar3 * dVar9 * dVar136 * dVar6 +
             dVar54 * dVar12 * dVar3 * dVar74 * dVar7 +
             dVar54 * dVar134 * dVar3 * dVar2 * dVar136 * dVar6 +
             dVar53 * dVar134 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar28 * dVar5 * dVar27 * dVar9 * dVar136 * dVar75 +
             dVar85 * dVar5 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar85 * dVar5 * dVar140 * dVar2 * dVar136 * dVar75 +
             dVar28 * dVar5 * dVar140 * dVar114 * dVar7 +
             dVar85 * dVar12 * dVar3 * dVar9 * dVar136 * dVar75 +
             dVar28 * dVar12 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar28 * dVar134 * dVar3 * dVar2 * dVar136 * dVar75 +
             dVar134 * dVar85 * dVar3 * dVar114 * dVar7 +
             dVar95 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar142 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar140 * dVar142 * dVar10 * dVar9 * dVar75 +
             dVar140 * dVar95 * dVar37 * dVar136 * dVar6 +
             dVar26 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar71 * dVar27 * dVar11 * dVar136 * dVar75 +
             dVar140 * dVar71 * dVar10 * dVar2 * dVar75 +
             dVar140 * dVar26 * dVar37 * dVar136 * dVar75 +
             dVar84 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar83 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar83 * dVar5 * dVar10 * dVar2 * dVar6 +
             dVar140 * dVar84 * dVar5 * dVar37 * dVar9 * dVar7 +
             dVar12 * dVar83 * dVar3 * dVar11 * dVar136 * dVar6 +
             dVar12 * dVar84 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar84 * dVar134 * dVar3 * dVar37 * dVar136 * dVar6 +
             dVar83 * dVar134 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar25 * dVar5 * dVar27 * dVar10 * dVar9 * dVar75 +
             dVar24 * dVar5 * dVar27 * dVar11 * dVar2 * dVar7 +
             dVar140 * dVar24 * dVar5 * dVar10 * dVar2 * dVar75 +
             dVar140 * dVar25 * dVar5 * dVar37 * dVar2 * dVar7 +
             dVar12 * dVar25 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar12 * dVar24 * dVar3 * dVar11 * dVar136 * dVar75 +
             dVar25 * dVar134 * dVar3 * dVar37 * dVar136 * dVar75 +
             dVar24 * dVar134 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar153 * dVar12 * dVar140 * dVar10 * dVar6 * dVar7 +
             dVar52 * dVar12 * dVar140 * dVar11 * dVar89 +
             dVar52 * dVar134 * dVar140 * dVar10 * dVar75 * dVar7 +
             dVar153 * dVar134 * dVar140 * dVar37 * dVar89 +
             dVar112 * dVar12 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar23 * dVar12 * dVar27 * dVar11 * dVar89 +
             dVar23 * dVar134 * dVar27 * dVar10 * dVar75 * dVar7 +
             dVar134 * dVar112 * dVar27 * dVar37 * dVar89 +
             dVar139 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar131 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar140 * dVar131 * dVar10 * dVar2 * dVar6 +
             dVar140 * dVar139 * dVar11 * dVar136 * dVar75 +
             dVar138 * dVar27 * dVar10 * dVar9 * dVar75 +
             dVar70 * dVar27 * dVar37 * dVar136 * dVar6 +
             dVar140 * dVar70 * dVar10 * dVar2 * dVar75 +
             dVar140 * dVar138 * dVar37 * dVar136 * dVar75 +
             dVar82 * dVar5 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar81 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar81 * dVar5 * dVar37 * dVar136 * dVar6 +
             dVar140 * dVar82 * dVar5 * dVar11 * dVar2 * dVar7 +
             dVar12 * dVar81 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar82 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar134 * dVar82 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar134 * dVar81 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar21 * dVar5 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar22 * dVar5 * dVar27 * dVar11 * dVar136 * dVar75 +
             dVar140 * dVar21 * dVar5 * dVar37 * dVar136 * dVar75 +
             dVar140 * dVar22 * dVar5 * dVar37 * dVar2 * dVar7 +
             dVar12 * dVar21 * dVar3 * dVar10 * dVar9 * dVar75 +
             dVar12 * dVar22 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar134 * dVar22 * dVar3 * dVar10 * dVar2 * dVar75 +
             dVar134 * dVar21 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar80 * dVar1 * dVar12 * dVar140 * dVar37 * dVar10 * dVar6 +
             dVar125 * dVar1 * dVar12 * dVar140 * dVar11 * dVar10 * dVar75 +
             dVar125 * dVar1 * dVar134 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar80 * dVar1 * dVar134 * dVar27 * dVar11 * dVar10 * dVar75 +
             dVar99 * dVar5 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar157 * dVar5 * dVar27 * dVar124 * dVar7 +
             local_68 * dVar10 * dVar6 +
             dVar99 * dVar5 * dVar140 * dVar11 * dVar37 * dVar7 +
             dVar157 * dVar12 * dVar3 * dVar11 * dVar10 * dVar6 +
             dVar99 * dVar12 * dVar3 * dVar124 * dVar7 +
             dVar99 * dVar134 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar157 * dVar134 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar129 * dVar5 * dVar27 * dVar11 * dVar10 * dVar75 +
             dVar20 * dVar5 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar20 * dVar5 * dVar140 * dVar37 * dVar10 * dVar75 +
             dVar129 * dVar5 * dVar140 * dVar151 * dVar7 +
             dVar20 * dVar12 * dVar3 * dVar11 * dVar10 * dVar75 +
             dVar129 * dVar12 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar129 * dVar134 * dVar3 * dVar37 * dVar10 * dVar75 +
             dVar20 * dVar134 * dVar3 * dVar151 * dVar7 +
             dVar147 * dVar12 * dVar140 * dVar136 * dVar6 * dVar7 +
             dVar150 * dVar12 * dVar140 * dVar9 * dVar89 +
             dVar150 * dVar134 * dVar27 * dVar136 * dVar6 * dVar7 +
             dVar147 * dVar134 * dVar27 * dVar9 * dVar89 +
             dVar19 * dVar12 * dVar140 * dVar136 * dVar75 * dVar7 +
             dVar128 * dVar12 * dVar140 * dVar2 * dVar89 +
             dVar128 * dVar134 * dVar27 * dVar136 * dVar75 * dVar7 +
             dVar19 * dVar134 * dVar27 * dVar2 * dVar89 +
             dVar41 * dVar27 * dVar9 * dVar136 * dVar6 +
             dVar18 * dVar27 * dVar74 * dVar7 +
             dVar140 * dVar18 * dVar2 * dVar136 * dVar6 +
             dVar140 * dVar41 * dVar9 * dVar2 * dVar7 +
             dVar79 * dVar27 * dVar9 * dVar136 * dVar75 +
             dVar58 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar58 * dVar140 * dVar2 * dVar136 * dVar75 +
             dVar140 * dVar79 * dVar114 * dVar7 +
             dVar17 * dVar5 * dVar140 * dVar2 * dVar136 * dVar6 +
             dVar98 * dVar5 * dVar140 * dVar9 * dVar136 * dVar75 +
             dVar17 * dVar12 * dVar3 * dVar9 * dVar136 * dVar6 +
             dVar12 * dVar98 * dVar3 * dVar74 * dVar7 +
             dVar134 * dVar98 * dVar3 * dVar9 * dVar136 * dVar75 +
             dVar134 * dVar17 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar104 * dVar5 * dVar27 * dVar2 * dVar136 * dVar6 +
             dVar127 * dVar5 * dVar27 * dVar9 * dVar136 * dVar75 +
             dVar104 * dVar12 * dVar3 * dVar2 * dVar136 * dVar6 +
             dVar127 * dVar12 * dVar3 * dVar9 * dVar2 * dVar7 +
             dVar127 * dVar134 * dVar3 * dVar2 * dVar136 * dVar75 +
             dVar134 * dVar104 * dVar3 * dVar114 * dVar7 +
             dVar119 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar27 * dVar126 * dVar11 * dVar9 * dVar7 +
             dVar126 * dVar140 * dVar10 * dVar2 * dVar6 +
             dVar119 * dVar140 * dVar37 * dVar9 * dVar7 +
             dVar46 * dVar27 * dVar10 * dVar9 * dVar75 +
             dVar27 * dVar148 * dVar11 * dVar2 * dVar7 +
             dVar148 * dVar140 * dVar10 * dVar2 * dVar75 +
             dVar46 * dVar140 * dVar37 * dVar2 * dVar7 +
             dVar97 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar96 * dVar5 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar140 * dVar96 * dVar5 * dVar10 * dVar9 * dVar75 +
             dVar140 * dVar97 * dVar5 * dVar37 * dVar136 * dVar6 +
             dVar12 * dVar97 * dVar3 * dVar11 * dVar136 * dVar6 +
             dVar12 * dVar96 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar134 * dVar97 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar134 * dVar96 * dVar3 * dVar11 * dVar136 * dVar75 +
             dVar68 * dVar5 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar27 * dVar69 * dVar5 * dVar11 * dVar136 * dVar75 +
             dVar69 * dVar5 * dVar140 * dVar10 * dVar2 * dVar75 +
             local_78 * dVar136 * dVar75 +
             dVar12 * dVar68 * dVar3 * dVar37 * dVar136 * dVar6 +
             dVar12 * dVar69 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar69 * dVar134 * dVar3 * dVar37 * dVar136 * dVar75 +
             dVar68 * dVar134 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar117 * dVar27 * dVar9 * dVar136 * dVar6 +
             dVar118 * dVar27 * dVar74 * dVar7 +
             dVar140 * dVar118 * dVar9 * dVar136 * dVar75 +
             dVar140 * dVar117 * dVar9 * dVar2 * dVar7 +
             dVar113 * dVar27 * dVar2 * dVar136 * dVar6 +
             dVar50 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar50 * dVar140 * dVar2 * dVar136 * dVar75 +
             dVar113 * dVar140 * dVar114 * dVar7 +
             dVar57 * dVar27 * dVar9 * dVar136 * dVar6 +
             dVar42 * dVar27 * dVar74 * dVar7 +
             dVar140 * dVar42 * dVar9 * dVar136 * dVar75 +
             dVar140 * dVar57 * dVar9 * dVar2 * dVar7 +
             dVar78 * dVar13 * dVar134 * dVar3 * dVar2 * dVar136 * dVar6 +
             dVar149 * dVar13 * dVar134 * dVar3 * dVar9 * dVar136 * dVar75 +
             dVar35 * dVar27 * dVar2 * dVar136 * dVar6 +
             dVar36 * dVar27 * dVar9 * dVar2 * dVar7 +
             dVar36 * dVar140 * dVar2 * dVar136 * dVar75 +
             dVar35 * dVar140 * dVar114 * dVar7 +
             dVar149 * dVar137 * dVar12 * dVar3 * dVar2 * dVar136 * dVar6 +
             dVar78 * dVar137 * dVar12 * dVar3 * dVar9 * dVar136 * dVar75 +
             dVar94 * dVar1 * dVar12 * dVar3 * dVar37 * dVar74 +
             dVar156 * dVar1 * dVar12 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar156 * dVar1 * dVar134 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar94 * dVar1 * dVar134 * dVar3 * dVar11 * dVar114 +
             dVar156 * dVar13 * dVar5 * dVar3 * dVar37 * dVar74 +
             dVar94 * dVar13 * dVar5 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar94 * dVar137 * dVar5 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar137 * dVar156 * dVar5 * dVar3 * dVar11 * dVar114 +
             dVar116 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar67 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar67 * dVar10 * dVar9 * dVar75 +
             dVar140 * dVar116 * dVar11 * dVar2 * dVar7 +
             dVar115 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar91 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar140 * dVar91 * dVar10 * dVar2 * dVar75 +
             dVar140 * dVar115 * dVar37 * dVar2 * dVar7 +
             dVar87 * dVar5 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar88 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar87 * dVar5 * dVar37 * dVar9 * dVar7 +
             dVar140 * dVar88 * dVar5 * dVar11 * dVar136 * dVar75 +
             dVar12 * dVar87 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar88 * dVar3 * dVar11 * dVar136 * dVar6 +
             dVar134 * dVar88 * dVar3 * dVar10 * dVar9 * dVar75 +
             dVar134 * dVar87 * dVar3 * dVar37 * dVar136 * dVar6 +
             dVar66 * dVar5 * dVar27 * dVar37 * dVar136 * dVar6 +
             dVar111 * dVar5 * dVar27 * dVar11 * dVar2 * dVar7 +
             local_88 * dVar136 * dVar75 +
             dVar66 * dVar5 * dVar140 * dVar37 * dVar2 * dVar7 +
             dVar66 * dVar12 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar111 * dVar12 * dVar3 * dVar11 * dVar136 * dVar75 +
             dVar111 * dVar134 * dVar3 * dVar10 * dVar2 * dVar75 +
             dVar66 * dVar134 * dVar3 * dVar37 * dVar136 * dVar75 +
             dVar34 * dVar27 * dVar37 * dVar74 +
             dVar141 * dVar27 * dVar11 * dVar9 * dVar2 +
             dVar141 * dVar140 * dVar37 * dVar9 * dVar2 +
             dVar34 * dVar140 * dVar11 * dVar114 +
             dVar93 * dVar13 * dVar5 * dVar3 * dVar37 * dVar74 +
             dVar77 * dVar13 * dVar5 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar77 * dVar137 * dVar5 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar93 * dVar137 * dVar5 * dVar3 * dVar11 * dVar114 +
             dVar60 * dVar5 * dVar27 * dVar11 * dVar37 * dVar9 +
             dVar59 * dVar5 * dVar27 * dVar124 * dVar2 +
             dVar59 * dVar5 * dVar140 * dVar151 * dVar9 +
             dVar60 * dVar5 * dVar140 * dVar11 * dVar37 * dVar2 +
             dVar59 * dVar12 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar60 * dVar12 * dVar3 * dVar124 * dVar2 +
             dVar60 * dVar134 * dVar3 * dVar151 * dVar9 +
             dVar59 * dVar134 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar8 * dVar12 * dVar140 * dVar10 * dVar6 * dVar7 +
             local_58 * dVar12 * dVar140 * dVar11 * dVar89 +
             local_58 * dVar134 * dVar27 * dVar10 * dVar6 * dVar7 +
             dVar8 * dVar134 * dVar27 * dVar11 * dVar89 +
             dVar103 * dVar12 * dVar140 * dVar10 * dVar75 * dVar7 +
             local_48 * dVar12 * dVar140 * dVar37 * dVar89 +
             local_48 * dVar134 * dVar27 * dVar10 * dVar75 * dVar7 +
             dVar134 * dVar103 * dVar27 * dVar37 * dVar89 +
             dVar109 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar27 * dVar110 * dVar11 * dVar9 * dVar7 +
             dVar110 * dVar140 * dVar37 * dVar136 * dVar6 +
             dVar109 * dVar140 * dVar11 * dVar2 * dVar7 +
             dVar27 * dVar45 * dVar37 * dVar9 * dVar7 +
             dVar44 * dVar27 * dVar11 * dVar136 * dVar75 +
             dVar45 * dVar140 * dVar37 * dVar136 * dVar75 +
             dVar44 * dVar140 * dVar37 * dVar2 * dVar7 +
             dVar40 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar154 * dVar5 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar140 * dVar154 * dVar5 * dVar10 * dVar2 * dVar6 +
             dVar140 * dVar40 * dVar5 * dVar11 * dVar136 * dVar75 +
             dVar12 * dVar154 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar40 * dVar3 * dVar11 * dVar9 * dVar7 +
             dVar134 * dVar40 * dVar3 * dVar10 * dVar9 * dVar75 +
             dVar134 * dVar154 * dVar3 * dVar11 * dVar2 * dVar7 +
             dVar65 * dVar5 * dVar27 * dVar10 * dVar9 * dVar75 +
             dVar27 * dVar64 * dVar5 * dVar37 * dVar136 * dVar6 +
             dVar64 * dVar5 * dVar140 * dVar10 * dVar2 * dVar75 +
             local_98 * dVar136 * dVar75 +
             dVar12 * dVar64 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar12 * dVar65 * dVar3 * dVar37 * dVar9 * dVar7 +
             dVar65 * dVar134 * dVar3 * dVar10 * dVar2 * dVar75 +
             dVar64 * dVar134 * dVar3 * dVar37 * dVar2 * dVar7 +
             dVar132 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar108 * dVar27 * dVar124 * dVar7 +
             dVar140 * dVar108 * dVar37 * dVar10 * dVar6 +
             dVar140 * dVar132 * dVar11 * dVar37 * dVar7 +
             dVar48 * dVar27 * dVar11 * dVar10 * dVar75 +
             dVar43 * dVar27 * dVar11 * dVar37 * dVar7 +
             local_a8 * dVar10 * dVar75 +
             dVar140 * dVar48 * dVar151 * dVar7 +
             dVar63 * dVar5 * dVar140 * dVar37 * dVar10 * dVar6 +
             dVar145 * dVar5 * dVar140 * dVar11 * dVar10 * dVar75 +
             dVar63 * dVar12 * dVar3 * dVar11 * dVar10 * dVar6 +
             dVar12 * dVar145 * dVar3 * dVar124 * dVar7 +
             dVar134 * dVar145 * dVar3 * dVar11 * dVar10 * dVar75 +
             dVar134 * dVar63 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar39 * dVar5 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar107 * dVar5 * dVar27 * dVar11 * dVar10 * dVar75 +
             dVar39 * dVar12 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar107 * dVar12 * dVar3 * dVar11 * dVar37 * dVar7 +
             dVar107 * dVar134 * dVar3 * dVar37 * dVar10 * dVar75 +
             dVar134 * dVar39 * dVar3 * dVar151 * dVar7 +
             dVar106 * dVar27 * dVar11 * dVar136 * dVar6 +
             dVar90 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar106 * dVar37 * dVar9 * dVar7 +
             dVar140 * dVar90 * dVar11 * dVar136 * dVar75 +
             dVar105 * dVar27 * dVar37 * dVar136 * dVar6 +
             dVar123 * dVar27 * dVar11 * dVar2 * dVar7 +
             dVar140 * dVar123 * dVar37 * dVar136 * dVar75 +
             dVar140 * dVar105 * dVar37 * dVar2 * dVar7 +
             dVar144 * dVar5 * dVar27 * dVar10 * dVar9 * dVar6 +
             dVar143 * dVar5 * dVar27 * dVar11 * dVar9 * dVar7 +
             dVar140 * dVar143 * dVar5 * dVar10 * dVar9 * dVar75 +
             dVar140 * dVar144 * dVar5 * dVar11 * dVar2 * dVar7 +
             dVar12 * dVar143 * dVar3 * dVar10 * dVar9 * dVar6 +
             dVar12 * dVar144 * dVar3 * dVar11 * dVar136 * dVar6 +
             dVar134 * dVar144 * dVar3 * dVar10 * dVar2 * dVar6 +
             dVar134 * dVar143 * dVar3 * dVar11 * dVar136 * dVar75 +
             dVar102 * dVar5 * dVar27 * dVar10 * dVar2 * dVar6 +
             dVar122 * dVar5 * dVar27 * dVar37 * dVar9 * dVar7 +
             dVar122 * dVar5 * dVar140 * dVar10 * dVar2 * dVar75 +
             dVar102 * dVar5 * dVar140 * dVar37 * dVar2 * dVar7 +
             dVar122 * dVar12 * dVar3 * dVar10 * dVar9 * dVar75 +
             dVar102 * dVar12 * dVar3 * dVar37 * dVar136 * dVar6 +
             dVar102 * dVar134 * dVar3 * dVar10 * dVar2 * dVar75 +
             dVar122 * dVar134 * dVar3 * dVar37 * dVar136 * dVar75 +
             dVar38 * dVar5 * dVar27 * dVar37 * dVar74 +
             dVar16 * dVar5 * dVar27 * dVar11 * dVar9 * dVar2 +
             dVar16 * dVar5 * dVar140 * dVar37 * dVar9 * dVar2 +
             dVar38 * dVar5 * dVar140 * dVar11 * dVar114 +
             dVar16 * dVar12 * dVar3 * dVar37 * dVar74 +
             dVar38 * dVar12 * dVar3 * dVar11 * dVar9 * dVar2 +
             dVar38 * dVar134 * dVar3 * dVar37 * dVar9 * dVar2 +
             dVar134 * dVar16 * dVar3 * dVar11 * dVar114 +
             dVar33 * dVar27 * dVar11 * dVar37 * dVar9 +
             dVar73 * dVar27 * dVar124 * dVar2 +
             dVar140 * dVar73 * dVar151 * dVar9 +
             dVar140 * dVar33 * dVar11 * dVar37 * dVar2 +
             dVar61 * dVar13 * dVar5 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar121 * dVar13 * dVar5 * dVar3 * dVar124 * dVar2 +
             dVar121 * dVar137 * dVar5 * dVar3 * dVar151 * dVar9 +
             dVar61 * dVar137 * dVar5 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar100 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar101 * dVar27 * dVar124 * dVar7 +
             dVar140 * dVar101 * dVar11 * dVar10 * dVar75 +
             dVar140 * dVar100 * dVar11 * dVar37 * dVar7 +
             dVar158 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar76 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar76 * dVar140 * dVar37 * dVar10 * dVar75 +
             dVar158 * dVar140 * dVar151 * dVar7 +
             dVar130 * dVar27 * dVar11 * dVar10 * dVar6 +
             dVar32 * dVar27 * dVar124 * dVar7 +
             dVar140 * dVar32 * dVar11 * dVar10 * dVar75 +
             dVar140 * dVar130 * dVar11 * dVar37 * dVar7 +
             dVar14 * dVar13 * dVar134 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar15 * dVar13 * dVar134 * dVar3 * dVar11 * dVar10 * dVar75 +
             dVar72 * dVar27 * dVar37 * dVar10 * dVar6 +
             dVar92 * dVar27 * dVar11 * dVar37 * dVar7 +
             dVar92 * dVar140 * dVar37 * dVar10 * dVar75 +
             dVar72 * dVar140 * dVar151 * dVar7 +
             dVar12 * dVar15 * dVar137 * dVar3 * dVar37 * dVar10 * dVar6 +
             dVar12 * dVar14 * dVar137 * dVar3 * dVar11 * dVar10 * dVar75 +
             dVar155 * dVar1 * dVar12 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar120 * dVar1 * dVar12 * dVar3 * dVar124 * dVar2 +
             dVar120 * dVar1 * dVar134 * dVar3 * dVar151 * dVar9 +
             dVar155 * dVar1 * dVar134 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar120 * dVar13 * dVar5 * dVar3 * dVar11 * dVar37 * dVar9 +
             dVar155 * dVar13 * dVar5 * dVar3 * dVar124 * dVar2 +
             dVar120 * dVar137 * dVar5 * dVar3 * dVar11 * dVar37 * dVar2 +
             dVar155 * dVar137 * dVar5 * dVar3 * dVar151 * dVar9;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_20);
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xd];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x11];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar39 = dVar10 * dVar140 * dVar89;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x14];
  dVar29 = -dVar10;
  dVar47 = dVar140 * dVar29 * dVar89;
  dVar137 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x13];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x15];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xb];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[4];
  dVar45 = dVar10 * dVar11;
  dVar37 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar28 = dVar45 * dVar37;
  dVar134 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar43 = dVar134 * dVar140;
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar33 = dVar140 * -dVar12;
  dVar67 = -dVar12 * dVar11;
  dVar35 = dVar11 * dVar29;
  dVar93 = dVar35 * dVar37;
  dVar48 = dVar45 * dVar89;
  dVar94 = dVar35 * dVar89;
  dVar129 = -dVar134;
  dVar96 = dVar140 * dVar129;
  dVar49 = dVar96 * dVar37;
  dVar102 = dVar27 * dVar49;
  dVar105 = dVar43 * dVar37;
  dVar76 = dVar96 * dVar89;
  dVar46 = dVar43 * dVar89;
  dVar50 = dVar11 * dVar129 * dVar37;
  dVar91 = dVar134 * dVar11 * dVar37;
  dVar75 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[5];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar92 = dVar47 * dVar27 * dVar6;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar58 = dVar39 * dVar27 * dVar6;
  dVar14 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar104 = dVar47 * dVar15 * dVar6;
  dVar68 = dVar28 * dVar27;
  dVar113 = dVar93 * dVar27;
  dVar125 = dVar93 * dVar15;
  dVar16 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xc];
  dVar59 = dVar28 * dVar15;
  dVar131 = dVar48 * dVar27;
  dVar114 = dVar94 * dVar27;
  dVar143 = dVar94 * dVar15;
  dVar60 = dVar48 * dVar15;
  dVar144 = dVar105 * dVar27;
  dVar62 = dVar105 * dVar15;
  dVar145 = dVar49 * dVar15;
  dVar154 = dVar76 * dVar27;
  dVar69 = dVar46 * dVar27;
  dVar40 = dVar46 * dVar15;
  dVar70 = dVar76 * dVar15;
  dVar54 = dVar27 * dVar91 * dVar6;
  dVar8 = dVar27 * dVar50 * dVar6;
  dVar17 = dVar91 * dVar15 * dVar6;
  dVar64 = dVar6 * dVar39 * dVar15;
  dVar65 = dVar47 * dVar13 * dVar16;
  dVar38 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[8];
  dVar41 = dVar140 * dVar29 * dVar38;
  dVar18 = dVar41 * dVar15 * dVar16;
  dVar103 = dVar28 * dVar13 * dVar16;
  dVar19 = dVar10 * dVar75 * dVar37;
  dVar97 = dVar27 * dVar19;
  dVar19 = dVar19 * dVar15;
  dVar73 = dVar10 * dVar75 * dVar89;
  dVar20 = dVar73 * dVar27;
  dVar21 = dVar20 * dVar1;
  dVar22 = dVar6 * dVar50 * dVar15;
  dVar23 = dVar50 * dVar13 * dVar16;
  dVar24 = dVar91 * dVar13 * dVar1;
  dVar25 = dVar129 * dVar75 * dVar37;
  dVar77 = dVar25 * dVar27;
  dVar78 = dVar77 * dVar1;
  dVar26 = dVar33 * dVar37;
  dVar95 = dVar26 * dVar27;
  dVar61 = dVar39 * dVar13 * dVar16;
  dVar63 = dVar47 * dVar13 * dVar1;
  dVar10 = dVar10 * dVar140 * dVar38;
  dVar71 = dVar10 * dVar27 * dVar1;
  dVar79 = dVar28 * dVar13 * dVar1;
  dVar28 = dVar93 * dVar13 * dVar1;
  dVar55 = dVar35 * dVar38 * dVar27;
  dVar138 = dVar45 * dVar38 * dVar27;
  dVar139 = dVar138 * dVar1;
  dVar36 = dVar29 * dVar75 * dVar37;
  dVar142 = dVar27 * dVar36;
  dVar42 = dVar29 * dVar75 * dVar89;
  dVar146 = dVar42 * dVar27;
  dVar80 = dVar46 * dVar13 * dVar16;
  dVar29 = dVar76 * dVar13 * dVar16;
  dVar30 = dVar43 * dVar38 * dVar27;
  dVar133 = dVar96 * dVar38 * dVar15;
  dVar81 = dVar16 * dVar133;
  dVar82 = dVar134 * dVar75 * dVar37;
  dVar83 = dVar82 * dVar15;
  dVar148 = dVar16 * dVar83;
  dVar152 = dVar12 * dVar140 * dVar37;
  dVar31 = dVar152 * dVar27;
  dVar44 = dVar12 * dVar140 * dVar89;
  dVar32 = dVar44 * dVar27;
  dVar33 = dVar33 * dVar89;
  dVar34 = dVar33 * dVar15;
  dVar84 = dVar16 * dVar34;
  dVar85 = dVar12 * dVar11 * dVar37;
  dVar56 = dVar27 * dVar85;
  dVar37 = dVar37 * dVar67;
  dVar86 = dVar27 * dVar37;
  dVar87 = dVar86 * dVar1;
  dVar85 = dVar85 * dVar15;
  dVar88 = dVar16 * dVar85;
  dVar106 = dVar137 * dVar137;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar35 = dVar35 * dVar38 * dVar15;
  dVar98 = dVar16 * dVar35;
  dVar36 = dVar36 * dVar15;
  dVar42 = dVar42 * dVar15;
  dVar99 = dVar16 * dVar42;
  dVar76 = dVar76 * dVar13 * dVar1;
  dVar43 = dVar43 * dVar38 * dVar15;
  dVar100 = dVar16 * dVar43;
  dVar152 = dVar152 * dVar15;
  dVar44 = dVar44 * dVar15;
  dVar101 = dVar16 * dVar44;
  dVar120 = dVar39 * dVar13 * dVar1;
  dVar107 = dVar41 * dVar27 * dVar1;
  dVar132 = dVar10 * dVar15 * dVar16;
  dVar108 = dVar93 * dVar13 * dVar16;
  dVar72 = dVar45 * dVar38 * dVar15;
  dVar109 = dVar16 * dVar72;
  dVar73 = dVar73 * dVar15;
  dVar110 = dVar16 * dVar73;
  dVar111 = dVar46 * dVar13 * dVar1;
  dVar96 = dVar96 * dVar38 * dVar27;
  dVar115 = dVar96 * dVar1;
  dVar116 = dVar91 * dVar13 * dVar16;
  dVar117 = dVar50 * dVar13 * dVar1;
  dVar82 = dVar82 * dVar27;
  dVar118 = dVar82 * dVar1;
  dVar25 = dVar25 * dVar15;
  dVar119 = dVar16 * dVar25;
  dVar26 = dVar26 * dVar15;
  dVar33 = dVar33 * dVar27;
  dVar126 = dVar33 * dVar1;
  dVar155 = dVar56 * dVar1;
  dVar37 = dVar37 * dVar15;
  dVar127 = dVar16 * dVar37;
  dVar128 = dVar9 * dVar9;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x1a];
  dVar41 = dVar134 * dVar11 * dVar38;
  dVar38 = dVar11 * dVar129 * dVar38;
  dVar93 = dVar129 * dVar75 * dVar89;
  dVar112 = dVar134 * dVar75 * dVar89;
  dVar66 = dVar12 * dVar11 * dVar89;
  dVar67 = dVar67 * dVar89;
  dVar156 = dVar27 * dVar93;
  dVar51 = dVar27 * dVar112;
  dVar112 = dVar112 * dVar15;
  dVar93 = dVar93 * dVar15;
  dVar90 = dVar27 * dVar66;
  dVar57 = dVar27 * dVar67;
  dVar67 = dVar67 * dVar15;
  dVar66 = dVar66 * dVar15;
  dVar134 = dVar146 * dVar1;
  dVar12 = dVar30 * dVar1;
  dVar74 = dVar41 * dVar27 * dVar1;
  dVar75 = dVar38 * dVar27 * dVar1;
  dVar38 = dVar38 * dVar15 * dVar16;
  dVar129 = dVar41 * dVar15 * dVar16;
  dVar41 = dVar32 * dVar1;
  dVar45 = dVar55 * dVar1;
  dVar52 = dVar5 * dVar5;
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x18];
  dVar121 = dVar3 * dVar3;
  dVar53 = dVar136 * dVar136;
  dVar46 = dVar140 * dVar140;
  local_28 = dVar67 * dVar1 * dVar7 * dVar46 * dVar11 +
             dVar66 * dVar1 * dVar7 * dVar136 * dVar140 * dVar10 +
             dVar16 * dVar66 * dVar14 * dVar46 * dVar11 +
             dVar67 * dVar16 * dVar14 * dVar136 * dVar140 * dVar10 +
             dVar90 * dVar1 * dVar7 * dVar46 * dVar89 +
             dVar57 * dVar1 * dVar7 * dVar3 * dVar140 * dVar10 +
             dVar16 * dVar57 * dVar14 * dVar46 * dVar89 +
             dVar16 * dVar90 * dVar14 * dVar3 * dVar140 * dVar10 +
             dVar37 * dVar1 * dVar7 * dVar5 * dVar140 * dVar11 +
             dVar85 * dVar1 * dVar7 * dVar5 * dVar136 * dVar10 +
             dVar88 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar127 * dVar14 * dVar9 * dVar140 * dVar10 +
             dVar7 * dVar127 * dVar5 * dVar3 * dVar10 +
             dVar7 * dVar88 * dVar137 * dVar140 * dVar10 +
             dVar87 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar155 * dVar14 * dVar9 * dVar140 * dVar10 +
             dVar7 * dVar155 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar87 * dVar137 * dVar140 * dVar10 +
             dVar16 * dVar86 * dVar14 * dVar5 * dVar140 * dVar89 +
             dVar16 * dVar56 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar34 * dVar1 * dVar7 * dVar5 * dVar140 * dVar11 +
             dVar44 * dVar1 * dVar7 * dVar9 * dVar140 * dVar10 +
             dVar101 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar84 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar7 * dVar101 * dVar5 * dVar3 * dVar10 +
             dVar7 * dVar84 * dVar137 * dVar140 * dVar10 +
             dVar14 * dVar41 * dVar5 * dVar136 * dVar10 +
             dVar14 * dVar126 * dVar9 * dVar140 * dVar10 +
             dVar41 * dVar7 * dVar5 * dVar140 * dVar89 +
             dVar126 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar33 * dVar16 * dVar14 * dVar5 * dVar140 * dVar89 +
             dVar32 * dVar16 * dVar14 * dVar137 * dVar140 * dVar10 +
             dVar26 * dVar1 * dVar7 * dVar52 * dVar11 +
             dVar152 * dVar1 * dVar7 * dVar9 * dVar5 * dVar10 +
             dVar152 * dVar16 * dVar14 * dVar52 * dVar11 +
             dVar26 * dVar16 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar31 * dVar1 * dVar7 * dVar52 * dVar89 +
             dVar95 * dVar1 * dVar7 * dVar137 * dVar5 * dVar10 +
             dVar95 * dVar16 * dVar14 * dVar52 * dVar89 +
             dVar31 * dVar16 * dVar14 * dVar137 * dVar5 * dVar10 +
             dVar112 * dVar1 * dVar7 * dVar46 * dVar11 +
             dVar93 * dVar1 * dVar7 * dVar136 * dVar140 * dVar10 +
             dVar93 * dVar16 * dVar7 * dVar46 * dVar89 +
             dVar112 * dVar16 * dVar7 * dVar3 * dVar140 * dVar10 +
             dVar156 * dVar1 * dVar14 * dVar46 * dVar11 +
             dVar51 * dVar1 * dVar14 * dVar136 * dVar140 * dVar10 +
             dVar16 * dVar51 * dVar14 * dVar46 * dVar89 +
             dVar16 * dVar156 * dVar14 * dVar3 * dVar140 * dVar10 +
             dVar83 * dVar1 * dVar7 * dVar5 * dVar140 * dVar11 +
             dVar25 * dVar1 * dVar7 * dVar5 * dVar136 * dVar10 +
             dVar148 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar119 * dVar14 * dVar9 * dVar140 * dVar10 +
             dVar7 * dVar119 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar148 * dVar137 * dVar140 * dVar10 +
             dVar78 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar14 * dVar118 * dVar9 * dVar140 * dVar10 +
             dVar118 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar78 * dVar7 * dVar137 * dVar140 * dVar10 +
             dVar82 * dVar16 * dVar14 * dVar5 * dVar140 * dVar89 +
             dVar77 * dVar16 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar38 * dVar14 * dVar46 * dVar11 +
             dVar129 * dVar14 * dVar136 * dVar140 * dVar10 +
             dVar129 * dVar7 * dVar46 * dVar89 +
             dVar38 * dVar7 * dVar3 * dVar140 * dVar10 +
             dVar74 * dVar14 * dVar46 * dVar11 +
             dVar75 * dVar14 * dVar136 * dVar140 * dVar10 +
             dVar75 * dVar7 * dVar46 * dVar89 +
             dVar74 * dVar7 * dVar3 * dVar140 * dVar10 +
             dVar24 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar117 * dVar9 * dVar136 * dVar140 +
             dVar117 * dVar7 * dVar5 * dVar136 * dVar3 +
             dVar24 * dVar7 * dVar137 * dVar136 * dVar140 +
             dVar23 * dVar14 * dVar5 * dVar136 * dVar3 +
             dVar116 * dVar14 * dVar9 * dVar3 * dVar140 +
             dVar116 * dVar7 * dVar5 * dVar121 +
             dVar23 * dVar7 * dVar137 * dVar3 * dVar140 +
             dVar22 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar17 * dVar9 * dVar136 * dVar140 +
             dVar17 * dVar7 * dVar5 * dVar136 * dVar3 +
             dVar22 * dVar7 * dVar137 * dVar136 * dVar140 +
             dVar50 * dVar15 * dVar16 * dVar2 * dVar137 * dVar136 * dVar140 +
             dVar91 * dVar15 * dVar16 * dVar2 * dVar9 * dVar3 * dVar140 +
             dVar54 * dVar14 * dVar5 * dVar136 * dVar3 +
             dVar8 * dVar14 * dVar9 * dVar3 * dVar140 +
             dVar7 * dVar8 * dVar5 * dVar121 +
             dVar7 * dVar54 * dVar137 * dVar3 * dVar140 +
             dVar1 * dVar27 * dVar91 * dVar2 * dVar137 * dVar136 * dVar140 +
             dVar1 * dVar27 * dVar50 * dVar2 * dVar9 * dVar3 * dVar140 +
             dVar133 * dVar1 * dVar7 * dVar5 * dVar136 * dVar10 +
             dVar43 * dVar1 * dVar7 * dVar9 * dVar140 * dVar10 +
             dVar81 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar100 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar7 * dVar100 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar81 * dVar137 * dVar140 * dVar10 +
             dVar12 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar14 * dVar115 * dVar9 * dVar140 * dVar10 +
             dVar115 * dVar7 * dVar5 * dVar140 * dVar89 +
             dVar12 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar96 * dVar16 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar30 * dVar16 * dVar14 * dVar137 * dVar140 * dVar10 +
             dVar76 * dVar14 * dVar5 * dVar53 +
             dVar14 * dVar111 * dVar9 * dVar136 * dVar140 +
             dVar111 * dVar7 * dVar5 * dVar136 * dVar3 +
             dVar76 * dVar7 * dVar9 * dVar3 * dVar140 +
             dVar80 * dVar14 * dVar5 * dVar136 * dVar3 +
             dVar29 * dVar14 * dVar137 * dVar136 * dVar140 +
             dVar7 * dVar29 * dVar5 * dVar121 +
             dVar7 * dVar80 * dVar137 * dVar3 * dVar140 +
             dVar40 * dVar6 * dVar7 * dVar137 * dVar136 * dVar140 +
             dVar70 * dVar6 * dVar7 * dVar9 * dVar3 * dVar140 +
             dVar1 * dVar40 * dVar2 * dVar5 * dVar53 +
             dVar1 * dVar70 * dVar2 * dVar9 * dVar136 * dVar140 +
             dVar70 * dVar16 * dVar2 * dVar5 * dVar136 * dVar3 +
             dVar40 * dVar16 * dVar2 * dVar137 * dVar136 * dVar140 +
             dVar154 * dVar6 * dVar14 * dVar137 * dVar136 * dVar140 +
             dVar69 * dVar6 * dVar14 * dVar9 * dVar3 * dVar140 +
             dVar154 * dVar1 * dVar2 * dVar5 * dVar136 * dVar3 +
             dVar69 * dVar1 * dVar2 * dVar9 * dVar3 * dVar140 +
             dVar16 * dVar69 * dVar2 * dVar5 * dVar121 +
             dVar16 * dVar154 * dVar2 * dVar137 * dVar3 * dVar140 +
             dVar105 * dVar13 * dVar1 * dVar7 * dVar137 * dVar5 * dVar136 +
             dVar49 * dVar13 * dVar1 * dVar7 * dVar9 * dVar5 * dVar3 +
             dVar49 * dVar13 * dVar16 * dVar14 * dVar137 * dVar5 * dVar136 +
             dVar105 * dVar13 * dVar16 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar145 * dVar6 * dVar14 * dVar9 * dVar5 * dVar136 +
             dVar62 * dVar6 * dVar14 * dVar128 * dVar140 +
             dVar62 * dVar6 * dVar7 * dVar137 * dVar5 * dVar136 +
             dVar145 * dVar6 * dVar7 * dVar9 * dVar137 * dVar140 +
             dVar62 * dVar1 * dVar2 * dVar9 * dVar5 * dVar136 +
             dVar145 * dVar1 * dVar2 * dVar128 * dVar140 +
             dVar145 * dVar16 * dVar2 * dVar137 * dVar5 * dVar136 +
             dVar62 * dVar16 * dVar2 * dVar9 * dVar137 * dVar140 +
             dVar144 * dVar6 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar102 * dVar6 * dVar14 * dVar9 * dVar137 * dVar140 +
             dVar102 * dVar6 * dVar7 * dVar137 * dVar5 * dVar3 +
             dVar144 * dVar6 * dVar7 * dVar106 * dVar140 +
             dVar102 * dVar1 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar144 * dVar1 * dVar2 * dVar9 * dVar137 * dVar140 +
             dVar144 * dVar16 * dVar2 * dVar137 * dVar5 * dVar3 +
             dVar16 * dVar102 * dVar2 * dVar106 * dVar140 +
             dVar73 * dVar1 * dVar7 * dVar5 * dVar140 * dVar11 +
             dVar42 * dVar1 * dVar7 * dVar9 * dVar140 * dVar10 +
             dVar99 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar110 * dVar14 * dVar9 * dVar140 * dVar10 +
             dVar7 * dVar99 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar110 * dVar5 * dVar3 * dVar10 +
             dVar14 * dVar134 * dVar5 * dVar140 * dVar11 +
             dVar14 * dVar21 * dVar5 * dVar136 * dVar10 +
             dVar134 * dVar7 * dVar5 * dVar3 * dVar10 +
             dVar21 * dVar7 * dVar137 * dVar140 * dVar10 +
             dVar20 * dVar16 * dVar14 * dVar5 * dVar140 * dVar89 +
             dVar146 * dVar16 * dVar14 * dVar137 * dVar140 * dVar10 +
             dVar19 * dVar1 * dVar7 * dVar52 * dVar11 +
             dVar36 * dVar1 * dVar7 * dVar9 * dVar5 * dVar10 +
             dVar36 * dVar16 * dVar7 * dVar52 * dVar89 +
             dVar19 * dVar16 * dVar7 * dVar137 * dVar5 * dVar10 +
             dVar142 * dVar1 * dVar14 * dVar52 * dVar11 +
             dVar97 * dVar1 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar16 * dVar97 * dVar14 * dVar52 * dVar89 +
             dVar16 * dVar142 * dVar14 * dVar137 * dVar5 * dVar10 +
             dVar72 * dVar1 * dVar7 * dVar5 * dVar136 * dVar10 +
             dVar35 * dVar1 * dVar7 * dVar9 * dVar140 * dVar10 +
             dVar98 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar109 * dVar14 * dVar9 * dVar140 * dVar10 +
             dVar7 * dVar109 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar98 * dVar5 * dVar3 * dVar10 +
             dVar139 * dVar14 * dVar5 * dVar140 * dVar11 +
             dVar45 * dVar14 * dVar5 * dVar136 * dVar10 +
             dVar7 * dVar45 * dVar5 * dVar140 * dVar89 +
             dVar7 * dVar139 * dVar137 * dVar140 * dVar10 +
             dVar16 * dVar138 * dVar14 * dVar5 * dVar3 * dVar10 +
             dVar16 * dVar55 * dVar14 * dVar137 * dVar140 * dVar10 +
             dVar94 * dVar13 * dVar1 * dVar7 * dVar137 * dVar136 * dVar140 +
             dVar48 * dVar13 * dVar1 * dVar7 * dVar9 * dVar3 * dVar140 +
             dVar48 * dVar13 * dVar16 * dVar14 * dVar137 * dVar136 * dVar140 +
             dVar94 * dVar13 * dVar16 * dVar14 * dVar9 * dVar3 * dVar140 +
             dVar60 * dVar6 * dVar14 * dVar5 * dVar53 +
             dVar143 * dVar6 * dVar14 * dVar9 * dVar136 * dVar140 +
             dVar143 * dVar6 * dVar7 * dVar5 * dVar136 * dVar3 +
             dVar60 * dVar6 * dVar7 * dVar9 * dVar3 * dVar140 +
             dVar143 * dVar1 * dVar2 * dVar5 * dVar53 +
             dVar60 * dVar1 * dVar2 * dVar9 * dVar136 * dVar140 +
             dVar60 * dVar16 * dVar2 * dVar5 * dVar136 * dVar3 +
             dVar143 * dVar16 * dVar2 * dVar9 * dVar3 * dVar140 +
             dVar114 * dVar6 * dVar14 * dVar5 * dVar136 * dVar3 +
             dVar131 * dVar6 * dVar14 * dVar137 * dVar136 * dVar140 +
             dVar131 * dVar6 * dVar7 * dVar5 * dVar121 +
             dVar114 * dVar6 * dVar7 * dVar137 * dVar3 * dVar140 +
             dVar131 * dVar1 * dVar2 * dVar5 * dVar136 * dVar3 +
             dVar114 * dVar1 * dVar2 * dVar137 * dVar136 * dVar140 +
             dVar114 * dVar16 * dVar2 * dVar5 * dVar121 +
             dVar131 * dVar16 * dVar2 * dVar137 * dVar3 * dVar140 +
             dVar79 * dVar14 * dVar9 * dVar5 * dVar136 +
             dVar28 * dVar14 * dVar128 * dVar140 +
             dVar7 * dVar28 * dVar137 * dVar5 * dVar136 +
             dVar7 * dVar79 * dVar9 * dVar137 * dVar140 +
             dVar108 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar103 * dVar14 * dVar9 * dVar137 * dVar140 +
             dVar103 * dVar7 * dVar137 * dVar5 * dVar3 +
             dVar7 * dVar108 * dVar106 * dVar140 +
             dVar125 * dVar6 * dVar7 * dVar137 * dVar5 * dVar136 +
             dVar59 * dVar6 * dVar7 * dVar9 * dVar5 * dVar3 +
             dVar125 * dVar1 * dVar2 * dVar9 * dVar5 * dVar136 +
             dVar1 * dVar59 * dVar2 * dVar128 * dVar140 +
             dVar16 * dVar59 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar16 * dVar125 * dVar2 * dVar9 * dVar137 * dVar140 +
             dVar68 * dVar6 * dVar14 * dVar137 * dVar5 * dVar136 +
             dVar113 * dVar6 * dVar14 * dVar9 * dVar5 * dVar3 +
             dVar68 * dVar1 * dVar2 * dVar137 * dVar5 * dVar136 +
             dVar113 * dVar1 * dVar2 * dVar9 * dVar137 * dVar140 +
             dVar113 * dVar16 * dVar2 * dVar137 * dVar5 * dVar3 +
             dVar68 * dVar16 * dVar2 * dVar106 * dVar140 +
             dVar18 * dVar14 * dVar52 * dVar11 +
             dVar132 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar132 * dVar7 * dVar52 * dVar89 +
             dVar18 * dVar7 * dVar137 * dVar5 * dVar10 +
             dVar71 * dVar14 * dVar52 * dVar11 +
             dVar107 * dVar14 * dVar9 * dVar5 * dVar10 +
             dVar7 * dVar107 * dVar52 * dVar89 +
             dVar7 * dVar71 * dVar137 * dVar5 * dVar10 +
             dVar63 * dVar14 * dVar9 * dVar5 * dVar136 +
             dVar120 * dVar14 * dVar128 * dVar140 +
             dVar7 * dVar120 * dVar9 * dVar5 * dVar3 +
             dVar7 * dVar63 * dVar9 * dVar137 * dVar140 +
             dVar61 * dVar14 * dVar137 * dVar5 * dVar136 +
             dVar65 * dVar14 * dVar9 * dVar137 * dVar140 +
             dVar65 * dVar7 * dVar137 * dVar5 * dVar3 +
             dVar61 * dVar7 * dVar106 * dVar140 +
             dVar64 * dVar14 * dVar9 * dVar5 * dVar136 +
             dVar104 * dVar14 * dVar128 * dVar140 +
             dVar7 * dVar104 * dVar9 * dVar5 * dVar3 +
             dVar7 * dVar64 * dVar9 * dVar137 * dVar140 +
             dVar39 * dVar15 * dVar16 * dVar2 * dVar137 * dVar5 * dVar136 +
             dVar47 * dVar15 * dVar16 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar92 * dVar14 * dVar137 * dVar5 * dVar136 +
             dVar58 * dVar14 * dVar9 * dVar137 * dVar140 +
             dVar58 * dVar7 * dVar137 * dVar5 * dVar3 +
             dVar92 * dVar7 * dVar106 * dVar140 +
             dVar39 * dVar27 * dVar1 * dVar2 * dVar9 * dVar5 * dVar3 +
             dVar47 * dVar27 * dVar1 * dVar2 * dVar137 * dVar5 * dVar136;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar4,&local_28);
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar89 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [1];
  dVar13 = dVar1 * dVar140 * dVar89;
  dVar11 = dVar140 * -dVar1 * dVar89;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [4];
  dVar37 = -dVar1 * dVar9;
  dVar134 = dVar37 * dVar89;
  dVar154 = dVar1 * dVar9 * dVar89;
  dVar39 = dVar140 * -dVar2;
  dVar131 = dVar2 * dVar140 * dVar89;
  dVar89 = dVar39 * dVar89;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar37 = dVar37 * dVar10;
  dVar8 = dVar1 * dVar9 * dVar10;
  dVar17 = dVar2 * dVar140 * dVar10;
  dVar39 = dVar39 * dVar10;
  dVar38 = -dVar2 * dVar9 * dVar10;
  dVar10 = dVar2 * dVar9 * dVar10;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[10];
  dVar7 = dVar37 * dVar27;
  dVar14 = dVar8 * dVar27;
  dVar8 = dVar8 * dVar140;
  dVar37 = dVar37 * dVar140;
  dVar94 = dVar134 * dVar27;
  dVar104 = dVar154 * dVar27;
  dVar154 = dVar154 * dVar140;
  dVar134 = dVar134 * dVar140;
  dVar125 = dVar17 * dVar27;
  dVar12 = dVar39 * dVar27;
  dVar39 = dVar39 * dVar140;
  dVar17 = dVar17 * dVar140;
  dVar75 = dVar131 * dVar27;
  dVar6 = dVar89 * dVar27;
  dVar89 = dVar89 * dVar140;
  dVar131 = dVar131 * dVar140;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xd];
  dVar40 = dVar13 * dVar27 * dVar1;
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x13];
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x14];
  dVar143 = dVar11 * dVar27 * dVar1;
  dVar137 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x10];
  dVar136 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x12];
  dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar144 = dVar11 * dVar140 * dVar3;
  dVar145 = dVar13 * dVar140 * dVar3;
  dVar15 = dVar38 * dVar27 * dVar1;
  dVar13 = dVar27 * dVar10 * dVar1;
  dVar16 = dVar10 * dVar140 * dVar3;
  dVar11 = dVar38 * dVar140 * dVar3;
  dVar93 = dVar5 * dVar5;
  dVar140 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x16];
  dVar27 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x17];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar38 = dVar27 * dVar27;
  local_30 = dVar16 * dVar137 * dVar5 * dVar10 * dVar27 +
             dVar11 * dVar137 * dVar136 * dVar38 +
             dVar2 * dVar11 * dVar5 * dVar140 * dVar27 +
             dVar16 * dVar2 * dVar9 * dVar38 +
             dVar15 * dVar137 * dVar5 * dVar10 * dVar27 +
             dVar13 * dVar137 * dVar136 * dVar38 +
             dVar13 * dVar2 * dVar5 * dVar140 * dVar27 +
             dVar2 * dVar15 * dVar9 * dVar38 +
             dVar89 * dVar1 * dVar2 * dVar5 * dVar10 * dVar27 +
             dVar131 * dVar1 * dVar2 * dVar136 * dVar38 +
             dVar131 * dVar3 * dVar2 * dVar5 * dVar140 * dVar27 +
             dVar89 * dVar3 * dVar2 * dVar9 * dVar38 +
             dVar75 * dVar1 * dVar137 * dVar5 * dVar10 * dVar27 +
             dVar6 * dVar1 * dVar137 * dVar136 * dVar38 +
             dVar6 * dVar3 * dVar137 * dVar5 * dVar140 * dVar27 +
             dVar75 * dVar3 * dVar137 * dVar9 * dVar38 +
             dVar39 * dVar1 * dVar2 * dVar93 * dVar10 +
             dVar17 * dVar1 * dVar2 * dVar136 * dVar5 * dVar27 +
             dVar17 * dVar3 * dVar137 * dVar93 * dVar10 +
             dVar39 * dVar3 * dVar137 * dVar136 * dVar5 * dVar27 +
             dVar125 * dVar1 * dVar2 * dVar93 * dVar140 +
             dVar12 * dVar1 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar12 * dVar3 * dVar137 * dVar93 * dVar140 +
             dVar125 * dVar3 * dVar137 * dVar9 * dVar5 * dVar27 +
             dVar154 * dVar1 * dVar2 * dVar5 * dVar10 * dVar27 +
             dVar134 * dVar1 * dVar2 * dVar136 * dVar38 +
             dVar134 * dVar3 * dVar137 * dVar5 * dVar10 * dVar27 +
             dVar154 * dVar3 * dVar137 * dVar136 * dVar38 +
             dVar94 * dVar1 * dVar2 * dVar5 * dVar140 * dVar27 +
             dVar104 * dVar1 * dVar2 * dVar9 * dVar38 +
             dVar104 * dVar3 * dVar137 * dVar5 * dVar140 * dVar27 +
             dVar94 * dVar3 * dVar137 * dVar9 * dVar38 +
             dVar8 * dVar1 * dVar2 * dVar93 * dVar10 +
             dVar37 * dVar1 * dVar2 * dVar136 * dVar5 * dVar27 +
             dVar37 * dVar3 * dVar2 * dVar93 * dVar140 +
             dVar8 * dVar3 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar7 * dVar1 * dVar137 * dVar93 * dVar10 +
             dVar14 * dVar1 * dVar137 * dVar136 * dVar5 * dVar27 +
             dVar14 * dVar3 * dVar137 * dVar93 * dVar140 +
             dVar7 * dVar3 * dVar137 * dVar9 * dVar5 * dVar27 +
             dVar144 * dVar137 * dVar93 * dVar10 +
             dVar145 * dVar137 * dVar136 * dVar5 * dVar27 +
             dVar145 * dVar2 * dVar93 * dVar140 +
             dVar144 * dVar2 * dVar9 * dVar5 * dVar27 +
             dVar40 * dVar137 * dVar93 * dVar10 +
             dVar143 * dVar137 * dVar136 * dVar5 * dVar27 +
             dVar40 * dVar2 * dVar9 * dVar5 * dVar27 + dVar143 * dVar2 * dVar93 * dVar140;
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_(pCVar4,&local_30);
  if ((local_f8.m_currentBlockRows + local_f8.m_row == 5) && (local_f8.m_col == 1)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 1>>::finished() [MatrixType = Eigen::Matrix<double, 5, 1>]"
               );
}

Assistant:

inline Eigen::Matrix<double, 5, 1> calculate_coefficients(const Eigen::Matrix<double, 27, 1> &x) {
    Eigen::Matrix<double, 5, 1> coeffs;
    coeffs << x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] + x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] + x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) + x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) + x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] - x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] - x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] - x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] - x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] - x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] + x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] + x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] - x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] + x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] - x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] - x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] + x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) + x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] + x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] - x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] - x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] + x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] + x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] - x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] + x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] - x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] - x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] + x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] + x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] + x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] + x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] - x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] + x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] - x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] - x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] + x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] - x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] + x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] - x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] - x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) + x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] + x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] + x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] + x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] - x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] - x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] - x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] + x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] - x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] + x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] - x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] - x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] - x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] + x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] + x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] - x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] + x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] + x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] - x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] - x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] + x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] + x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] - x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] + x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) + x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] - x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] - x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] + x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] + x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] - x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] - x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] + x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] - x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] + x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] - x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] + x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] - x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] + x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] + x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] - x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] - x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] - x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] + x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] - x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] + x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) - x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] + x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] - x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] + x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] - x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] - x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] - x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] - x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] - x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] + x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] - x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] + x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] - x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] - x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] + x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] + x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] - x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] - x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] + x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] + x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] + x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] - x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] + x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] - x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] - x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] + x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] - x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] - x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] - x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] + x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] + x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] - x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] - x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] - x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] - x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] + x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] - x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] - x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] + x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) + x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] + x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] + x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] + x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] - x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] - x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] + x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] - x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] - x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] - x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] + x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] + x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] - x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] - x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] + x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) - x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] - x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] - x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] - x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] + x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] + x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] - x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] + x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] + x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] - x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] + x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] + x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] - x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] + x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] - x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] + x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24] + x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] + x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] + x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] - x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] - x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] + x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] + x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] + x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] - x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] - x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] + x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] + x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] - x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] + x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] + x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] - x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] + x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] - x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] + x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] - x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] + x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] + x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] - x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] - x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23];  // NOLINT [whitespace/line_length]

        return coeffs;
    }